

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

Token * __thiscall EOPlus::Lexer::ReadToken(Token *__return_storage_ptr__,Lexer *this)

{
  char c_00;
  bool bVar1;
  int iVar2;
  Lexer_Error *this_00;
  Token *pTVar3;
  char c;
  char cc;
  Token *local_178;
  undefined1 local_170 [80];
  code *local_120 [2];
  code *local_110;
  code *local_108;
  Token token;
  undefined1 local_b0 [64];
  undefined1 local_70 [64];
  
  local_178 = __return_storage_ptr__;
  util::variant::variant((variant *)local_70);
  Token::Token(&token,Invalid,(variant *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 0x10));
  c = '\0';
  do {
    local_120[1] = (code *)0x0;
    local_120[0] = ctype_whitespace;
    local_108 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_110 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar1 = GetCharIf(this,&c,(function<bool_(char)> *)local_120);
    std::_Function_base::~_Function_base((_Function_base *)local_120);
  } while (bVar1);
  pTVar3 = (this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->token_buffer).c.super__Deque_base<EOPlus::Token,_std::allocator<EOPlus::Token>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur == pTVar3) {
    bVar1 = PeekChar(this,&c);
    pTVar3 = local_178;
    c_00 = c;
    if (bVar1) {
      if ((int)c - 0x30U < 10) {
        ReadNumber((Token *)local_170,this);
LAB_0012ef3d:
        Token::operator=(&token,(Token *)local_170);
        std::__cxx11::string::~string((string *)(local_170 + 0x18));
      }
      else {
        bVar1 = ctype_ident_start(c);
        if (bVar1) {
          ReadIdentifier((Token *)local_170,this);
          goto LAB_0012ef3d;
        }
        bVar1 = ctype_symbol(c_00);
        if (bVar1) {
          ReadSymbol((Token *)local_170,this);
          goto LAB_0012ef3d;
        }
        bVar1 = ctype_op(c);
        if (bVar1) {
          cc = '\0';
          ReadOperator((Token *)local_170,this);
          Token::operator=(&token,(Token *)local_170);
          std::__cxx11::string::~string((string *)(local_170 + 0x18));
          iVar2 = util::variant::GetInt(&token.data);
          if ((iVar2 == 0xf) && (bVar1 = PeekChar(this,&cc), bVar1 && cc == '/')) {
            while (c != '\n') {
              GetChar(this,&c);
            }
            ReadToken(pTVar3,this);
            goto LAB_0012ef77;
          }
        }
        else if (c == '\"') {
          ReadString((Token *)local_170,this);
          goto LAB_0012ef3d;
        }
      }
      if (token.type == Invalid) {
        this_00 = (Lexer_Error *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_170,"Unknown token",(allocator<char> *)&cc);
        Lexer_Error::Lexer_Error(this_00,(string *)local_170,this->row,this->col);
        __cxa_throw(this_00,&Lexer_Error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      util::variant::variant((variant *)local_b0);
      Token::Token((Token *)local_170,EndOfFile,(variant *)local_b0);
      Token::operator=(&token,(Token *)local_170);
      std::__cxx11::string::~string((string *)(local_170 + 0x18));
      std::__cxx11::string::~string((string *)(local_b0 + 0x10));
    }
  }
  else {
    Token::operator=(&token,pTVar3);
    pTVar3 = local_178;
    std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>::pop_front(&(this->token_buffer).c);
  }
  Token::Token(pTVar3,&token);
LAB_0012ef77:
  std::__cxx11::string::~string((string *)&token.data.val_string);
  return pTVar3;
}

Assistant:

Token Lexer::ReadToken()
	{
		Token token;

		char c = '\0';

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_digit(c))
			{
				token = this->ReadNumber();
			}
			else if (ctype_ident_start(c))
			{
				token = this->ReadIdentifier();
			}
			else if (ctype_symbol(c))
			{
				token = this->ReadSymbol();
			}
			else if (ctype_op(c)) // Assumes '/' is a valid operator
			{
				char cc = '\0';
				token = this->ReadOperator();

				if (int(token.data) == UOP2('/', '\0') && this->PeekChar(cc) && cc == '/') // Line-comments
				{
					while (c != '\n')
						this->GetChar(c);

					return this->ReadToken();
				}
			}
			else if (c == '"')
			{
				token = this->ReadString();
			}

			if (token.type == Token::Invalid)
				throw Lexer_Error("Unknown token", this->row, this->col);

			return token;
		}

		token = Token(Token::EndOfFile);

		return token;
	}